

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O2

void sfts_head2str(sfts_t *f,char ***keys,char ***vals,char ***coms)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  size_t sVar6;
  char **ppcVar7;
  int i;
  int nkey;
  char *__s2;
  int *status;
  char *str;
  sfts_t *local_1b8;
  char *longstr;
  int nkeys;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  int *local_188;
  char ***local_180;
  char ***local_178;
  char ***local_170;
  char com [81];
  char _msg [31];
  char val [81];
  char skey [81];
  
  status = &f->stat;
  local_1b8 = f;
  local_180 = keys;
  local_178 = vals;
  local_170 = coms;
  ffghsp(f->fts,&nkeys,(int *)0x0,status);
  local_190 = g_array_sized_new(1,0,8,nkeys);
  local_198 = g_array_sized_new(1,0,8,nkeys);
  local_1a0 = g_array_sized_new(1,0,8,nkeys);
  nkey = 1;
  local_188 = status;
  do {
    if (nkeys < nkey) {
      if (*status == 0) {
        ppcVar7 = (char **)g_array_free(local_190,0);
        *local_180 = ppcVar7;
        ppcVar7 = (char **)g_array_free(local_198,0);
        *local_178 = ppcVar7;
        ppcVar7 = (char **)g_array_free(local_1a0,0);
        *local_170 = ppcVar7;
        return;
      }
      if (local_1b8->name == (char *)0x0) {
        uVar4 = g_strdup("memory");
      }
      else {
        uVar4 = g_path_get_basename();
      }
      ffgerr(*status,_msg);
      _msg[0x1e] = '\0';
      _p2sc_msg("sfts_head2str",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
                ,0x284,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,"FITS: %s: %s",
                _msg,uVar4);
      exit(1);
    }
    ffgkyn(local_1b8->fts,nkey,skey,val,com,status);
    uVar4 = g_strchug(skey);
    pcVar5 = (char *)g_strchomp(uVar4);
    iVar2 = strcmp("CONTINUE",pcVar5);
    if (iVar2 != 0) {
      __s2 = "COMMENT";
      if (*pcVar5 != '\0') {
        __s2 = pcVar5;
      }
      iVar2 = strcmp("HISTORY",__s2);
      if (iVar2 == 0) {
LAB_0010cd27:
        bVar1 = false;
      }
      else {
        iVar2 = strcmp("COMMENT",__s2);
        if (iVar2 == 0) goto LAB_0010cd27;
        ffgkls(local_1b8->fts,__s2,&longstr,com,local_188);
        pcVar5 = longstr;
        sVar6 = strlen(longstr);
        bVar1 = true;
        if ((0x44 < (int)sVar6) && (uVar3 = (int)sVar6 - 1, pcVar5[uVar3] == '&')) {
          pcVar5[uVar3] = '\0';
        }
      }
      str = (char *)g_strdup(__s2);
      g_array_append_vals(local_190,&str,1);
      pcVar5 = val;
      if (bVar1) {
        pcVar5 = longstr;
      }
      str = (char *)g_strdup(pcVar5);
      g_array_append_vals(local_198,&str,1);
      str = (char *)g_strdup(com);
      g_array_append_vals(local_1a0,&str,1);
      status = local_188;
      if (bVar1) {
        fffree(longstr,local_188);
      }
    }
    nkey = nkey + 1;
  } while( true );
}

Assistant:

void sfts_head2str(sfts_t *f, char ***keys, char ***vals, char ***coms) {
    int nkeys, *s = &f->stat;
    fits_get_hdrspace(f->fts, &nkeys, NULL, s);

    GArray *ak = g_array_sized_new(TRUE, FALSE, sizeof **keys, nkeys);
    GArray *av = g_array_sized_new(TRUE, FALSE, sizeof **vals, nkeys);
    GArray *ac = g_array_sized_new(TRUE, FALSE, sizeof **coms, nkeys);

    char *str, *longstr;
    char skey[SKEY_LEN], val[SKEY_LEN], com[SKEY_LEN];
    for (int i = 1; i <= nkeys; ++i) {
        fits_read_keyn(f->fts, i, skey, val, com, s);

        char *key = g_strstrip(skey);
        if (!strcmp("CONTINUE", key))
            continue;
        if (key[0] == 0)
            key = "COMMENT";

        int regular = strcmp("HISTORY", key) && strcmp("COMMENT", key);
        if (regular) {
            fits_read_key_longstr(f->fts, key, &longstr, com, s);
            // long strings may end in &, e.g., EUI FILE_RAW
            int len = strlen(longstr);
            if (len > 68 && longstr[len - 1] == '&')
                longstr[len - 1] = 0;
        }

        str = g_strdup(key);
        g_array_append_val(ak, str);
        str = g_strdup(regular ? longstr : val);
        g_array_append_val(av, str);
        str = g_strdup(com);
        g_array_append_val(ac, str);

        if (regular)
            fits_free_memory(longstr, s);
    }
    CHK_FTS(f);

    *keys = (char **) g_array_free(ak, FALSE);
    *vals = (char **) g_array_free(av, FALSE);
    *coms = (char **) g_array_free(ac, FALSE);
}